

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.cpp
# Opt level: O0

cl_int clGetSemaphoreInfoKHR_EMU
                 (cl_semaphore_khr semaphore,cl_semaphore_info_khr param_name,
                 size_t param_value_size,void *param_value,size_t *param_value_size_ret)

{
  bool bVar1;
  SConfig *pSVar2;
  cl_icd_dispatch *pcVar3;
  _cl_context **in_RCX;
  size_t in_RDX;
  undefined4 in_ESI;
  cl_semaphore_khr in_RDI;
  size_t *in_R8;
  cl_semaphore_payload_khr *ptr_3;
  cl_int eventStatus;
  cl_semaphore_payload_khr payload;
  cl_semaphore_type_khr *ptr_2;
  cl_uint *ptr_1;
  cl_context *ptr;
  CLIntercept *pIntercept;
  int local_5c;
  unsigned_long local_58;
  _cl_context **local_50;
  _cl_context **local_48;
  _cl_context **local_40;
  CLIntercept *local_38;
  size_t *local_30;
  _cl_context **local_28;
  size_t local_20;
  undefined4 local_14;
  cl_semaphore_khr local_10;
  cl_int local_4;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_38 = GetIntercept();
  if ((local_38 == (CLIntercept *)0x0) ||
     (pSVar2 = CLIntercept::config(local_38), (pSVar2->Emulate_cl_khr_semaphore & 1U) == 0)) {
    local_4 = -0x3b;
  }
  else {
    bVar1 = _cl_semaphore_khr::isValid(local_10);
    if (bVar1) {
      switch(local_14) {
      case 0x2039:
        local_40 = local_28;
        local_4 = CLIntercept::writeParamToMemory<_cl_context*>
                            (local_38,local_20,local_10->Context,local_30,local_28);
        break;
      case 0x203a:
        local_48 = local_28;
        local_4 = CLIntercept::writeParamToMemory<unsigned_int>
                            (local_38,local_20,local_10->RefCount,local_30,(uint *)local_28);
        break;
      case 0x203b:
        local_4 = -0x1e;
        break;
      case 0x203c:
        local_58 = 0;
        if (local_10->Event != (cl_event)0x0) {
          local_5c = 0;
          pcVar3 = CLIntercept::dispatch(local_38);
          (*pcVar3->clGetEventInfo)(local_10->Event,0x11d3,4,&local_5c,(size_t *)0x0);
          if (local_5c == 0) {
            local_58 = 1;
          }
        }
        local_4 = CLIntercept::writeParamToMemory<unsigned_long>
                            (local_38,local_20,local_58,local_30,(unsigned_long *)local_28);
        break;
      case 0x203d:
        local_50 = local_28;
        local_4 = CLIntercept::writeParamToMemory<unsigned_int>
                            (local_38,local_20,local_10->Type,local_30,(uint *)local_28);
        break;
      default:
        local_4 = -0x1e;
      }
    }
    else {
      local_4 = -0x476;
    }
  }
  return local_4;
}

Assistant:

cl_int CL_API_CALL clGetSemaphoreInfoKHR_EMU(
    cl_semaphore_khr semaphore,
    cl_semaphore_info_khr param_name,
    size_t param_value_size,
    void *param_value,
    size_t *param_value_size_ret)
{
    CLIntercept*    pIntercept = GetIntercept();
    if( pIntercept == NULL || !pIntercept->config().Emulate_cl_khr_semaphore )
    {
        return CL_INVALID_OPERATION;
    }
    if( !cli_semaphore::isValid(semaphore) )
    {
        return CL_INVALID_SEMAPHORE_KHR;
    }

    switch( param_name )
    {
    case CL_SEMAPHORE_CONTEXT_KHR:
        {
            auto*   ptr = (cl_context*)param_value;
            return pIntercept->writeParamToMemory(
                param_value_size,
                semaphore->Context,
                param_value_size_ret,
                ptr );
        }
    case CL_SEMAPHORE_REFERENCE_COUNT_KHR:
        {
            auto*   ptr = (cl_uint*)param_value;
            return pIntercept->writeParamToMemory(
                param_value_size,
                semaphore->RefCount,
                param_value_size_ret,
                ptr );
        }
    case CL_SEMAPHORE_PROPERTIES_KHR:
        // TODO!
        return CL_INVALID_VALUE;
    case CL_SEMAPHORE_TYPE_KHR:
        {
            auto*   ptr = (cl_semaphore_type_khr*)param_value;
            return pIntercept->writeParamToMemory(
                param_value_size,
                semaphore->Type,
                param_value_size_ret,
                ptr );
        }
        break;
    case CL_SEMAPHORE_PAYLOAD_KHR:
        {
            // For binary semaphores, the payload should be zero if the
            // semaphore is in the unsignaled state and one if it is in
            // the signaled state.
            cl_semaphore_payload_khr payload = 0;
            if( semaphore->Event != NULL )
            {
                cl_int  eventStatus = 0;
                pIntercept->dispatch().clGetEventInfo(
                    semaphore->Event,
                    CL_EVENT_COMMAND_EXECUTION_STATUS,
                    sizeof( eventStatus ),
                    &eventStatus,
                    NULL );
                if( eventStatus == CL_COMPLETE )
                {
                    payload = 1;
                }
            }

            auto*   ptr = (cl_semaphore_payload_khr*)param_value;
            return pIntercept->writeParamToMemory(
                param_value_size,
                payload,
                param_value_size_ret,
                ptr );
        }
        break;
    default:
        return CL_INVALID_VALUE;
    }

    return CL_INVALID_OPERATION;
}